

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int init_blocksize(vorb *f,int b,int n)

{
  float *pfVar1;
  short sVar2;
  short sVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar27;
  float *pfVar28;
  float *pfVar29;
  uint16 *puVar30;
  byte bVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  int iVar36;
  ulong uVar37;
  double dVar38;
  double dVar39;
  int iVar41;
  undefined1 auVar40 [16];
  int iVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar65;
  undefined1 auVar60 [16];
  int iVar66;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar71;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  ushort uVar78;
  undefined1 auVar83 [12];
  undefined1 in_XMM15 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  long lVar48;
  undefined4 uVar79;
  undefined6 uVar80;
  undefined8 uVar81;
  undefined1 auVar82 [12];
  undefined1 auVar84 [14];
  undefined1 auVar85 [14];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  
  uVar34 = n * 2 & 0xfffffffc;
  pfVar28 = (float *)setup_malloc(f,uVar34);
  f->A[(uint)b] = pfVar28;
  pfVar28 = (float *)setup_malloc(f,uVar34);
  f->B[(uint)b] = pfVar28;
  pfVar29 = (float *)setup_malloc(f,n & 0xfffffffc);
  f->C[(uint)b] = pfVar29;
  pfVar28 = f->A[(uint)b];
  if (((pfVar28 != (float *)0x0) && (pfVar29 != (float *)0x0)) &&
     (pfVar1 = f->B[(uint)b], pfVar1 != (float *)0x0)) {
    uVar32 = n >> 2;
    uVar27 = n >> 3;
    dVar45 = (double)n;
    if (0 < (int)uVar32) {
      lVar35 = 1;
      iVar36 = 0;
      uVar33 = uVar32;
      do {
        dVar38 = ((double)iVar36 * 3.141592653589793) / dVar45;
        dVar39 = cos(dVar38);
        pfVar28[lVar35 + -1] = (float)dVar39;
        dVar38 = sin(dVar38);
        pfVar28[lVar35] = -(float)dVar38;
        dVar38 = (((double)(int)lVar35 * 3.141592653589793) / dVar45) * 0.5;
        dVar39 = cos(dVar38);
        pfVar1[lVar35 + -1] = (float)dVar39 * 0.5;
        dVar38 = sin(dVar38);
        pfVar1[lVar35] = (float)dVar38 * 0.5;
        lVar35 = lVar35 + 2;
        iVar36 = iVar36 + 4;
        uVar33 = uVar33 - 1;
      } while (uVar33 != 0);
    }
    if (0 < (int)uVar27) {
      lVar35 = 2;
      uVar37 = (ulong)uVar27;
      do {
        dVar38 = ((double)(int)lVar35 * 3.141592653589793) / dVar45;
        dVar39 = cos(dVar38);
        *(float *)((long)pfVar29 + lVar35 * 2 + -4) = (float)dVar39;
        dVar38 = sin(dVar38);
        *(float *)((long)pfVar29 + lVar35 * 2) = -(float)dVar38;
        lVar35 = lVar35 + 4;
        uVar33 = (int)uVar37 - 1;
        uVar37 = (ulong)uVar33;
      } while (uVar33 != 0);
    }
    pfVar28 = (float *)setup_malloc(f,uVar34);
    f->window[(uint)b] = pfVar28;
    if (pfVar28 != (float *)0x0) {
      uVar34 = n >> 1;
      if (0 < (int)uVar34) {
        uVar37 = 0;
        do {
          dVar45 = sin((((double)(int)uVar37 + 0.5) / (double)(int)uVar34) * 0.5 * 3.141592653589793
                      );
          dVar45 = sin((double)((float)dVar45 * (float)dVar45) * 1.5707963267948966);
          pfVar28[uVar37] = (float)dVar45;
          uVar37 = uVar37 + 1;
        } while (uVar34 != uVar37);
      }
      puVar30 = (uint16 *)setup_malloc(f,uVar32 & 0xfffffffe);
      f->bit_reverse[(uint)b] = puVar30;
      if (puVar30 != (uint16 *)0x0) {
        if ((int)uVar27 < 1) {
          return 1;
        }
        iVar36 = ilog(n);
        auVar26 = _DAT_001812b0;
        auVar25 = _DAT_0017ad70;
        bVar31 = 0x24 - (char)iVar36;
        lVar35 = (ulong)uVar27 - 1;
        auVar40._8_4_ = (int)lVar35;
        auVar40._0_8_ = lVar35;
        auVar40._12_4_ = (int)((ulong)lVar35 >> 0x20);
        lVar35 = 0;
        auVar40 = auVar40 ^ _DAT_0017ad70;
        auVar68._8_4_ = 0xffffffff;
        auVar68._0_8_ = 0xffffffffffffffff;
        auVar68._12_4_ = 0xffffffff;
        auVar43 = _DAT_00181290;
        auVar44 = _DAT_001812a0;
        auVar47 = _DAT_00181190;
        auVar49 = _DAT_001811a0;
        auVar50 = _DAT_0017ad90;
        auVar51 = _DAT_0017ad60;
        do {
          auVar60 = auVar51 ^ auVar25;
          iVar36 = auVar40._0_4_;
          auVar67._0_4_ = -(uint)(iVar36 < auVar60._0_4_);
          iVar41 = auVar40._4_4_;
          auVar67._4_4_ = -(uint)(iVar41 < auVar60._4_4_);
          iVar71 = auVar40._8_4_;
          auVar67._8_4_ = -(uint)(iVar71 < auVar60._8_4_);
          iVar42 = auVar40._12_4_;
          auVar67._12_4_ = -(uint)(iVar42 < auVar60._12_4_);
          auVar77._4_4_ = auVar67._0_4_;
          auVar77._0_4_ = auVar67._0_4_;
          auVar77._8_4_ = auVar67._8_4_;
          auVar77._12_4_ = auVar67._8_4_;
          auVar86 = pshuflw(in_XMM15,auVar77,0xe8);
          iVar65 = -(uint)(auVar60._4_4_ == iVar41);
          iVar66 = -(uint)(auVar60._12_4_ == iVar42);
          auVar76._4_4_ = iVar65;
          auVar76._0_4_ = iVar65;
          auVar76._8_4_ = iVar66;
          auVar76._12_4_ = iVar66;
          auVar72 = pshuflw(in_XMM11,auVar76,0xe8);
          auVar60._4_4_ = auVar67._4_4_;
          auVar60._0_4_ = auVar67._4_4_;
          auVar60._8_4_ = auVar67._12_4_;
          auVar60._12_4_ = auVar67._12_4_;
          auVar67 = pshuflw(auVar67,auVar60,0xe8);
          auVar68 = (auVar67 | auVar72 & auVar86) ^ auVar68;
          auVar68 = packssdw(auVar68,auVar68);
          auVar72[1] = 0;
          auVar72[0] = auVar44[8];
          auVar72[2] = auVar44[9];
          auVar72[3] = 0;
          auVar72[4] = auVar44[10];
          auVar72[5] = 0;
          auVar72[6] = auVar44[0xb];
          auVar72[7] = 0;
          auVar72[8] = auVar44[0xc];
          auVar72[9] = 0;
          auVar72[10] = auVar44[0xd];
          auVar72[0xb] = 0;
          auVar72[0xc] = auVar44[0xe];
          auVar72[0xd] = 0;
          auVar72[0xe] = auVar44[0xf];
          auVar72[0xf] = 0;
          auVar67 = pshuflw(auVar72,auVar72,0x1b);
          auVar67 = pshufhw(auVar67,auVar67,0x1b);
          auVar4[0xd] = 0;
          auVar4._0_13_ = auVar44._0_13_;
          auVar4[0xe] = auVar44[7];
          auVar5[0xc] = auVar44[6];
          auVar5._0_12_ = auVar44._0_12_;
          auVar5._13_2_ = auVar4._13_2_;
          auVar7[0xb] = 0;
          auVar7._0_11_ = auVar44._0_11_;
          auVar7._12_3_ = auVar5._12_3_;
          auVar9[10] = auVar44[5];
          auVar9._0_10_ = auVar44._0_10_;
          auVar9._11_4_ = auVar7._11_4_;
          auVar11[9] = 0;
          auVar11._0_9_ = auVar44._0_9_;
          auVar11._10_5_ = auVar9._10_5_;
          auVar13[8] = auVar44[4];
          auVar13._0_8_ = auVar44._0_8_;
          auVar13._9_6_ = auVar11._9_6_;
          auVar19._7_8_ = 0;
          auVar19._0_7_ = auVar13._8_7_;
          auVar23._1_8_ = SUB158(auVar19 << 0x40,7);
          auVar23[0] = auVar44[3];
          auVar23._9_6_ = 0;
          auVar16[4] = auVar44[2];
          auVar16._0_4_ = auVar44._0_4_;
          auVar16._5_10_ = SUB1510(auVar23 << 0x30,5);
          auVar20._11_4_ = 0;
          auVar20._0_11_ = auVar16._4_11_;
          auVar18[2] = auVar44[1];
          auVar18._0_2_ = auVar44._0_2_;
          auVar18._3_12_ = SUB1512(auVar20 << 0x20,3);
          auVar87._0_2_ = auVar44._0_2_ & 0xff;
          auVar87._2_13_ = auVar18._2_13_;
          auVar87[0xf] = 0;
          auVar72 = pshuflw(auVar87,auVar87,0x1b);
          auVar72 = pshufhw(auVar72,auVar72,0x1b);
          sVar2 = auVar72._0_2_;
          sVar3 = auVar72._2_2_;
          uVar78 = CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar72[2] - (0xff < sVar3),
                            (0 < sVar2) * (sVar2 < 0x100) * auVar72[0] - (0xff < sVar2));
          sVar2 = auVar72._4_2_;
          sVar3 = auVar72._6_2_;
          uVar79 = CONCAT13((0 < sVar3) * (sVar3 < 0x100) * auVar72[6] - (0xff < sVar3),
                            CONCAT12((0 < sVar2) * (sVar2 < 0x100) * auVar72[4] - (0xff < sVar2),
                                     uVar78));
          sVar2 = auVar72._8_2_;
          sVar3 = auVar72._10_2_;
          uVar80 = CONCAT15((0 < sVar3) * (sVar3 < 0x100) * auVar72[10] - (0xff < sVar3),
                            CONCAT14((0 < sVar2) * (sVar2 < 0x100) * auVar72[8] - (0xff < sVar2),
                                     uVar79));
          sVar2 = auVar72._12_2_;
          sVar3 = auVar72._14_2_;
          uVar81 = CONCAT17((0 < sVar3) * (sVar3 < 0x100) * auVar72[0xe] - (0xff < sVar3),
                            CONCAT16((0 < sVar2) * (sVar2 < 0x100) * auVar72[0xc] - (0xff < sVar2),
                                     uVar80));
          sVar2 = auVar67._0_2_;
          sVar3 = auVar67._2_2_;
          auVar82._0_10_ =
               CONCAT19((0 < sVar3) * (sVar3 < 0x100) * auVar67[2] - (0xff < sVar3),
                        CONCAT18((0 < sVar2) * (sVar2 < 0x100) * auVar67[0] - (0xff < sVar2),uVar81)
                       );
          sVar2 = auVar67._4_2_;
          auVar82[10] = (0 < sVar2) * (sVar2 < 0x100) * auVar67[4] - (0xff < sVar2);
          sVar2 = auVar67._6_2_;
          auVar82[0xb] = (0 < sVar2) * (sVar2 < 0x100) * auVar67[6] - (0xff < sVar2);
          sVar2 = auVar67._8_2_;
          auVar84[0xc] = (0 < sVar2) * (sVar2 < 0x100) * auVar67[8] - (0xff < sVar2);
          auVar84._0_12_ = auVar82;
          sVar2 = auVar67._10_2_;
          auVar84[0xd] = (0 < sVar2) * (sVar2 < 0x100) * auVar67[10] - (0xff < sVar2);
          sVar2 = auVar67._12_2_;
          auVar88[0xe] = (0 < sVar2) * (sVar2 < 0x100) * auVar67[0xc] - (0xff < sVar2);
          auVar88._0_14_ = auVar84;
          sVar2 = auVar67._14_2_;
          auVar88[0xf] = (0 < sVar2) * (sVar2 < 0x100) * auVar67[0xe] - (0xff < sVar2);
          auVar86._0_2_ = uVar78 >> 4;
          auVar86._2_2_ = (ushort)((uint)uVar79 >> 0x14);
          auVar86._4_2_ = (ushort)((uint6)uVar80 >> 0x24);
          auVar86._6_2_ = (ushort)((ulong)uVar81 >> 0x34);
          auVar86._8_2_ = (ushort)((unkuint10)auVar82._0_10_ >> 0x44);
          auVar86._10_2_ = auVar82._10_2_ >> 4;
          auVar86._12_2_ = auVar84._12_2_ >> 4;
          auVar86._14_2_ = auVar88._14_2_ >> 4;
          auVar67 = psllw(auVar88 & auVar26,4);
          auVar67 = auVar67 | auVar86 & auVar26;
          auVar73._0_2_ = auVar67._0_2_ >> 2;
          auVar73._2_2_ = auVar67._2_2_ >> 2;
          auVar73._4_2_ = auVar67._4_2_ >> 2;
          auVar73._6_2_ = auVar67._6_2_ >> 2;
          auVar73._8_2_ = auVar67._8_2_ >> 2;
          auVar73._10_2_ = auVar67._10_2_ >> 2;
          auVar73._12_2_ = auVar67._12_2_ >> 2;
          auVar73._14_2_ = auVar67._14_2_ >> 2;
          auVar67 = psllw(auVar67 & _DAT_001812c0,2);
          auVar67 = auVar67 | auVar73 & _DAT_001812c0;
          auVar74._0_2_ = auVar67._0_2_ >> 1;
          auVar74._2_2_ = auVar67._2_2_ >> 1;
          auVar74._4_2_ = auVar67._4_2_ >> 1;
          auVar74._6_2_ = auVar67._6_2_ >> 1;
          auVar74._8_2_ = auVar67._8_2_ >> 1;
          auVar74._10_2_ = auVar67._10_2_ >> 1;
          auVar74._12_2_ = auVar67._12_2_ >> 1;
          auVar74._14_2_ = auVar67._14_2_ >> 1;
          auVar67 = auVar67 & _DAT_001812d0;
          auVar89[1] = auVar67[1] * '\x02';
          auVar89[0] = auVar67[0] * '\x02';
          auVar89[2] = auVar67[2] * '\x02';
          auVar89[3] = auVar67[3] * '\x02';
          auVar89[4] = auVar67[4] * '\x02';
          auVar89[5] = auVar67[5] * '\x02';
          auVar89[6] = auVar67[6] * '\x02';
          auVar89[7] = auVar67[7] * '\x02';
          auVar89[8] = auVar67[8] * '\x02';
          auVar89[9] = auVar67[9] * '\x02';
          auVar89[10] = auVar67[10] * '\x02';
          auVar89[0xb] = auVar67[0xb] * '\x02';
          auVar89[0xc] = auVar67[0xc] * '\x02';
          auVar89[0xd] = auVar67[0xd] * '\x02';
          auVar89[0xe] = auVar67[0xe] * '\x02';
          auVar89[0xf] = auVar67[0xf] * '\x02';
          auVar89 = auVar89 | auVar74 & _DAT_001812d0;
          if ((auVar68 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)((long)puVar30 + lVar35) = (short)((auVar89._0_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar60 = auVar76 & auVar77 | auVar60;
          auVar77 = packssdw(auVar60,auVar60);
          auVar68._8_4_ = 0xffffffff;
          auVar68._0_8_ = 0xffffffffffffffff;
          auVar68._12_4_ = 0xffffffff;
          auVar77 = packssdw(auVar77 ^ auVar68,auVar77 ^ auVar68);
          if ((auVar77._0_4_ >> 0x10 & 1) != 0) {
            *(short *)((long)puVar30 + lVar35 + 2) =
                 (short)((auVar89._4_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar77 = auVar50 ^ auVar25;
          iVar65 = -(uint)(iVar36 < auVar77._0_4_);
          auVar69._4_4_ = -(uint)(iVar41 < auVar77._4_4_);
          iVar66 = -(uint)(iVar71 < auVar77._8_4_);
          auVar69._12_4_ = -(uint)(iVar42 < auVar77._12_4_);
          auVar52._4_4_ = iVar65;
          auVar52._0_4_ = iVar65;
          auVar52._8_4_ = iVar66;
          auVar52._12_4_ = iVar66;
          auVar61._4_4_ = -(uint)(auVar77._4_4_ == iVar41);
          auVar61._12_4_ = -(uint)(auVar77._12_4_ == iVar42);
          auVar61._0_4_ = auVar61._4_4_;
          auVar61._8_4_ = auVar61._12_4_;
          auVar69._0_4_ = auVar69._4_4_;
          auVar69._8_4_ = auVar69._12_4_;
          auVar77 = auVar61 & auVar52 | auVar69;
          auVar77 = packssdw(auVar77,auVar77);
          auVar75 = packssdw(auVar77 ^ auVar68,auVar77 ^ auVar68);
          if ((auVar75 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            auVar75._0_8_ = auVar89._8_8_;
            auVar75._8_4_ = auVar89._8_4_;
            auVar75._12_4_ = auVar89._12_4_;
            *(short *)((long)puVar30 + lVar35 + 4) =
                 (short)((auVar89._8_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar77 = pshufhw(auVar52,auVar52,0x84);
          auVar67 = pshufhw(auVar61,auVar61,0x84);
          auVar60 = pshufhw(auVar77,auVar69,0x84);
          auVar77 = (auVar60 | auVar67 & auVar77) ^ auVar68;
          auVar77 = packssdw(auVar77,auVar77);
          if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)((long)puVar30 + lVar35 + 6) =
                 (short)((auVar89._12_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar53[1] = 0;
          auVar53[0] = auVar43[8];
          auVar53[2] = auVar43[9];
          auVar53[3] = 0;
          auVar53[4] = auVar43[10];
          auVar53[5] = 0;
          auVar53[6] = auVar43[0xb];
          auVar53[7] = 0;
          auVar53[8] = auVar43[0xc];
          auVar53[9] = 0;
          auVar53[10] = auVar43[0xd];
          auVar53[0xb] = 0;
          auVar53[0xc] = auVar43[0xe];
          auVar53[0xd] = 0;
          auVar53[0xe] = auVar43[0xf];
          auVar53[0xf] = 0;
          auVar77 = pshuflw(auVar53,auVar53,0x1b);
          auVar77 = pshufhw(auVar77,auVar77,0x1b);
          auVar6[0xd] = 0;
          auVar6._0_13_ = auVar43._0_13_;
          auVar6[0xe] = auVar43[7];
          auVar8[0xc] = auVar43[6];
          auVar8._0_12_ = auVar43._0_12_;
          auVar8._13_2_ = auVar6._13_2_;
          auVar10[0xb] = 0;
          auVar10._0_11_ = auVar43._0_11_;
          auVar10._12_3_ = auVar8._12_3_;
          auVar12[10] = auVar43[5];
          auVar12._0_10_ = auVar43._0_10_;
          auVar12._11_4_ = auVar10._11_4_;
          auVar14[9] = 0;
          auVar14._0_9_ = auVar43._0_9_;
          auVar14._10_5_ = auVar12._10_5_;
          auVar15[8] = auVar43[4];
          auVar15._0_8_ = auVar43._0_8_;
          auVar15._9_6_ = auVar14._9_6_;
          auVar21._7_8_ = 0;
          auVar21._0_7_ = auVar15._8_7_;
          auVar24._1_8_ = SUB158(auVar21 << 0x40,7);
          auVar24[0] = auVar43[3];
          auVar24._9_6_ = 0;
          auVar17[4] = auVar43[2];
          auVar17._0_4_ = auVar43._0_4_;
          auVar17._5_10_ = SUB1510(auVar24 << 0x30,5);
          auVar22._11_4_ = 0;
          auVar22._0_11_ = auVar17._4_11_;
          auVar62._3_12_ = SUB1512(auVar22 << 0x20,3);
          auVar62[2] = auVar43[1];
          auVar62[0] = auVar43[0];
          auVar62[1] = 0;
          auVar62[0xf] = 0;
          auVar60 = pshuflw(auVar62,auVar62,0x1b);
          auVar60 = pshufhw(auVar89,auVar60,0x1b);
          sVar2 = auVar60._0_2_;
          sVar3 = auVar60._2_2_;
          uVar78 = CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar60[2] - (0xff < sVar3),
                            (0 < sVar2) * (sVar2 < 0x100) * auVar60[0] - (0xff < sVar2));
          sVar2 = auVar60._4_2_;
          sVar3 = auVar60._6_2_;
          uVar79 = CONCAT13((0 < sVar3) * (sVar3 < 0x100) * auVar60[6] - (0xff < sVar3),
                            CONCAT12((0 < sVar2) * (sVar2 < 0x100) * auVar60[4] - (0xff < sVar2),
                                     uVar78));
          sVar2 = auVar60._8_2_;
          sVar3 = auVar60._10_2_;
          uVar80 = CONCAT15((0 < sVar3) * (sVar3 < 0x100) * auVar60[10] - (0xff < sVar3),
                            CONCAT14((0 < sVar2) * (sVar2 < 0x100) * auVar60[8] - (0xff < sVar2),
                                     uVar79));
          sVar2 = auVar60._12_2_;
          sVar3 = auVar60._14_2_;
          uVar81 = CONCAT17((0 < sVar3) * (sVar3 < 0x100) * auVar60[0xe] - (0xff < sVar3),
                            CONCAT16((0 < sVar2) * (sVar2 < 0x100) * auVar60[0xc] - (0xff < sVar2),
                                     uVar80));
          sVar2 = auVar77._0_2_;
          sVar3 = auVar77._2_2_;
          auVar83._0_10_ =
               CONCAT19((0 < sVar3) * (sVar3 < 0x100) * auVar77[2] - (0xff < sVar3),
                        CONCAT18((0 < sVar2) * (sVar2 < 0x100) * auVar77[0] - (0xff < sVar2),uVar81)
                       );
          sVar2 = auVar77._4_2_;
          auVar83[10] = (0 < sVar2) * (sVar2 < 0x100) * auVar77[4] - (0xff < sVar2);
          sVar2 = auVar77._6_2_;
          auVar83[0xb] = (0 < sVar2) * (sVar2 < 0x100) * auVar77[6] - (0xff < sVar2);
          sVar2 = auVar77._8_2_;
          auVar85[0xc] = (0 < sVar2) * (sVar2 < 0x100) * auVar77[8] - (0xff < sVar2);
          auVar85._0_12_ = auVar83;
          sVar2 = auVar77._10_2_;
          auVar85[0xd] = (0 < sVar2) * (sVar2 < 0x100) * auVar77[10] - (0xff < sVar2);
          sVar2 = auVar77._12_2_;
          auVar90[0xe] = (0 < sVar2) * (sVar2 < 0x100) * auVar77[0xc] - (0xff < sVar2);
          auVar90._0_14_ = auVar85;
          sVar2 = auVar77._14_2_;
          auVar90[0xf] = (0 < sVar2) * (sVar2 < 0x100) * auVar77[0xe] - (0xff < sVar2);
          auVar54._0_2_ = uVar78 >> 4;
          auVar54._2_2_ = (ushort)((uint)uVar79 >> 0x14);
          auVar54._4_2_ = (ushort)((uint6)uVar80 >> 0x24);
          auVar54._6_2_ = (ushort)((ulong)uVar81 >> 0x34);
          auVar54._8_2_ = (ushort)((unkuint10)auVar83._0_10_ >> 0x44);
          auVar54._10_2_ = auVar83._10_2_ >> 4;
          auVar54._12_2_ = auVar85._12_2_ >> 4;
          auVar54._14_2_ = auVar90._14_2_ >> 4;
          auVar77 = psllw(auVar90 & auVar26,4);
          auVar77 = auVar77 | auVar54 & auVar26;
          auVar55._0_2_ = auVar77._0_2_ >> 2;
          auVar55._2_2_ = auVar77._2_2_ >> 2;
          auVar55._4_2_ = auVar77._4_2_ >> 2;
          auVar55._6_2_ = auVar77._6_2_ >> 2;
          auVar55._8_2_ = auVar77._8_2_ >> 2;
          auVar55._10_2_ = auVar77._10_2_ >> 2;
          auVar55._12_2_ = auVar77._12_2_ >> 2;
          auVar55._14_2_ = auVar77._14_2_ >> 2;
          auVar77 = psllw(auVar77 & _DAT_001812c0,2);
          auVar77 = auVar77 | auVar55 & _DAT_001812c0;
          auVar56._0_2_ = auVar77._0_2_ >> 1;
          auVar56._2_2_ = auVar77._2_2_ >> 1;
          auVar56._4_2_ = auVar77._4_2_ >> 1;
          auVar56._6_2_ = auVar77._6_2_ >> 1;
          auVar56._8_2_ = auVar77._8_2_ >> 1;
          auVar56._10_2_ = auVar77._10_2_ >> 1;
          auVar56._12_2_ = auVar77._12_2_ >> 1;
          auVar56._14_2_ = auVar77._14_2_ >> 1;
          auVar77 = auVar77 & _DAT_001812d0;
          in_XMM15[1] = auVar77[1] * '\x02';
          in_XMM15[0] = auVar77[0] * '\x02';
          in_XMM15[2] = auVar77[2] * '\x02';
          in_XMM15[3] = auVar77[3] * '\x02';
          in_XMM15[4] = auVar77[4] * '\x02';
          in_XMM15[5] = auVar77[5] * '\x02';
          in_XMM15[6] = auVar77[6] * '\x02';
          in_XMM15[7] = auVar77[7] * '\x02';
          in_XMM15[8] = auVar77[8] * '\x02';
          in_XMM15[9] = auVar77[9] * '\x02';
          in_XMM15[10] = auVar77[10] * '\x02';
          in_XMM15[0xb] = auVar77[0xb] * '\x02';
          in_XMM15[0xc] = auVar77[0xc] * '\x02';
          in_XMM15[0xd] = auVar77[0xd] * '\x02';
          in_XMM15[0xe] = auVar77[0xe] * '\x02';
          in_XMM15[0xf] = auVar77[0xf] * '\x02';
          in_XMM15 = in_XMM15 | auVar56 & _DAT_001812d0;
          auVar77 = auVar49 ^ auVar25;
          iVar65 = -(uint)(iVar36 < auVar77._0_4_);
          auVar58._4_4_ = -(uint)(iVar41 < auVar77._4_4_);
          iVar66 = -(uint)(iVar71 < auVar77._8_4_);
          auVar58._12_4_ = -(uint)(iVar42 < auVar77._12_4_);
          auVar63._4_4_ = iVar65;
          auVar63._0_4_ = iVar65;
          auVar63._8_4_ = iVar66;
          auVar63._12_4_ = iVar66;
          auVar60 = pshuflw(auVar75,auVar63,0xe8);
          auVar57._4_4_ = -(uint)(auVar77._4_4_ == iVar41);
          auVar57._12_4_ = -(uint)(auVar77._12_4_ == iVar42);
          auVar57._0_4_ = auVar57._4_4_;
          auVar57._8_4_ = auVar57._12_4_;
          auVar67 = pshuflw(auVar25,auVar57,0xe8);
          auVar58._0_4_ = auVar58._4_4_;
          auVar58._8_4_ = auVar58._12_4_;
          auVar77 = pshuflw(auVar60,auVar58,0xe8);
          auVar77 = (auVar77 | auVar67 & auVar60) ^ auVar68;
          auVar77 = packssdw(auVar77,auVar77);
          if ((auVar77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(short *)((long)puVar30 + lVar35 + 8) =
                 (short)((in_XMM15._0_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar58 = auVar57 & auVar63 | auVar58;
          auVar77 = packssdw(auVar58,auVar58);
          auVar77 = packssdw(auVar77 ^ auVar68,auVar77 ^ auVar68);
          if ((auVar77 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(short *)((long)puVar30 + lVar35 + 10) =
                 (short)((in_XMM15._4_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar77 = auVar47 ^ auVar25;
          iVar36 = -(uint)(iVar36 < auVar77._0_4_);
          auVar70._4_4_ = -(uint)(iVar41 < auVar77._4_4_);
          iVar71 = -(uint)(iVar71 < auVar77._8_4_);
          auVar70._12_4_ = -(uint)(iVar42 < auVar77._12_4_);
          auVar59._4_4_ = iVar36;
          auVar59._0_4_ = iVar36;
          auVar59._8_4_ = iVar71;
          auVar59._12_4_ = iVar71;
          auVar64._4_4_ = -(uint)(auVar77._4_4_ == iVar41);
          auVar64._12_4_ = -(uint)(auVar77._12_4_ == iVar42);
          auVar64._0_4_ = auVar64._4_4_;
          auVar64._8_4_ = auVar64._12_4_;
          auVar70._0_4_ = auVar70._4_4_;
          auVar70._8_4_ = auVar70._12_4_;
          auVar77 = auVar64 & auVar59 | auVar70;
          auVar77 = packssdw(auVar77,auVar77);
          in_XMM11 = packssdw(auVar77 ^ auVar68,auVar77 ^ auVar68);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            in_XMM11._0_8_ = in_XMM15._8_8_;
            in_XMM11._8_4_ = in_XMM15._8_4_;
            in_XMM11._12_4_ = in_XMM15._12_4_;
            *(short *)((long)puVar30 + lVar35 + 0xc) =
                 (short)((in_XMM15._8_4_ >> (bVar31 & 0x1f)) << 2);
          }
          auVar77 = pshufhw(auVar59,auVar59,0x84);
          auVar67 = pshufhw(auVar64,auVar64,0x84);
          auVar60 = pshufhw(auVar77,auVar70,0x84);
          auVar77 = (auVar60 | auVar67 & auVar77) ^ auVar68;
          auVar77 = packssdw(auVar77,auVar77);
          if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(short *)((long)puVar30 + lVar35 + 0xe) =
                 (short)((in_XMM15._12_4_ >> (bVar31 & 0x1f)) << 2);
          }
          lVar48 = auVar51._8_8_;
          auVar51._0_8_ = auVar51._0_8_ + 8;
          auVar51._8_8_ = lVar48 + 8;
          lVar48 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + 8;
          auVar50._8_8_ = lVar48 + 8;
          lVar48 = auVar49._8_8_;
          auVar49._0_8_ = auVar49._0_8_ + 8;
          auVar49._8_8_ = lVar48 + 8;
          lVar48 = auVar47._8_8_;
          auVar47._0_8_ = auVar47._0_8_ + 8;
          auVar47._8_8_ = lVar48 + 8;
          auVar46._0_4_ = auVar44._0_4_ + 8;
          auVar46._4_4_ = auVar44._4_4_ + 8;
          auVar46._8_4_ = auVar44._8_4_ + 8;
          auVar46._12_4_ = auVar44._12_4_ + 8;
          auVar44._0_4_ = auVar43._0_4_ + 8;
          auVar44._4_4_ = auVar43._4_4_ + 8;
          auVar44._8_4_ = auVar43._8_4_ + 8;
          auVar44._12_4_ = auVar43._12_4_ + 8;
          lVar35 = lVar35 + 0x10;
          auVar43 = auVar44;
          auVar44 = auVar46;
        } while ((ulong)(uVar27 + 7 >> 3) << 4 != lVar35);
        return 1;
      }
    }
  }
  f->error = VORBIS_outofmem;
  return 0;
}

Assistant:

static int init_blocksize(vorb *f, int b, int n)
{
   int n2 = n >> 1, n4 = n >> 2, n8 = n >> 3;
   f->A[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->B[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   f->C[b] = (float *) setup_malloc(f, sizeof(float) * n4);
   if (!f->A[b] || !f->B[b] || !f->C[b]) return error(f, VORBIS_outofmem);
   compute_twiddle_factors(n, f->A[b], f->B[b], f->C[b]);
   f->window[b] = (float *) setup_malloc(f, sizeof(float) * n2);
   if (!f->window[b]) return error(f, VORBIS_outofmem);
   compute_window(n, f->window[b]);
   f->bit_reverse[b] = (uint16 *) setup_malloc(f, sizeof(uint16) * n8);
   if (!f->bit_reverse[b]) return error(f, VORBIS_outofmem);
   compute_bitreverse(n, f->bit_reverse[b]);
   return TRUE;
}